

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plane.cpp
# Opt level: O0

void __thiscall Plane::input(Plane *this,string *var,stringstream *ss)

{
  bool bVar1;
  istream *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  stringstream *in_stack_00000070;
  string *in_stack_00000078;
  Primitive *in_stack_00000080;
  Vector3 *in_stack_ffffffffffffffd8;
  
  bVar1 = std::operator==(in_RDI,(char *)in_stack_ffffffffffffffd8);
  if (bVar1) {
    operator>>((stringstream *)in_RDI,in_stack_ffffffffffffffd8);
  }
  else {
    bVar1 = std::operator==(in_RDI,(char *)in_stack_ffffffffffffffd8);
    if (bVar1) {
      operator>>((stringstream *)in_RDI,in_stack_ffffffffffffffd8);
    }
    else {
      bVar1 = std::operator==(in_RDI,(char *)in_stack_ffffffffffffffd8);
      if (bVar1) {
        operator>>((stringstream *)in_RDI,in_stack_ffffffffffffffd8);
      }
      else {
        bVar1 = std::operator==(in_RDI,(char *)in_stack_ffffffffffffffd8);
        if (bVar1) {
          std::istream::operator>>(in_RDX,(double *)((stringstream *)in_RDI + 0x98));
        }
        else {
          Primitive::input(in_stack_00000080,in_stack_00000078,in_stack_00000070);
        }
      }
    }
  }
  (**(code **)(*(long *)in_RDI + 8))();
  return;
}

Assistant:

void Plane::input(const std::string &var, std::stringstream &ss) {
    if (var == "Dx=") ss >> Dx;
    else if (var == "Dy=") ss >> Dy;
    else if (var == "N=") ss >> N;
    else if (var == "R=") ss >> r;
    else Primitive::input(var, ss);
    init();
}